

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::FieldOptions::SharedDtor(MessageLite *self)

{
  FeatureSet *this;
  FieldOptions_FeatureSupport *this_00;
  ulong uVar1;
  LogMessageFatal local_20;
  
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    this = (FeatureSet *)self[7]._vptr_MessageLite;
    if (this != (FeatureSet *)0x0) {
      FeatureSet::~FeatureSet(this);
    }
    operator_delete(this,0x50);
    this_00 = (FieldOptions_FeatureSupport *)self[7]._internal_metadata_.ptr_;
    if (this_00 != (FieldOptions_FeatureSupport *)0x0) {
      FieldOptions_FeatureSupport::~FieldOptions_FeatureSupport(this_00);
    }
    operator_delete(this_00,0x30);
    Impl_::~Impl_((Impl_ *)(self + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x26ef,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline void FieldOptions::SharedDtor(MessageLite& self) {
  FieldOptions& this_ = static_cast<FieldOptions&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.features_;
  delete this_._impl_.feature_support_;
  this_._impl_.~Impl_();
}